

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef
BinaryenStore(BinaryenModuleRef module,uint32_t bytes,uint32_t offset,uint32_t align,
             BinaryenExpressionRef ptr,BinaryenExpressionRef value,BinaryenType type,
             char *memoryName)

{
  Store *this;
  string_view sVar1;
  
  if (align == 0) {
    align = bytes;
  }
  sVar1 = (string_view)getMemoryName(module,memoryName);
  this = (Store *)MixedArena::allocSpace(&module->allocator,0x58,8);
  *(undefined8 *)&(this->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression = 0;
  (this->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression.type.id = 0;
  *(undefined8 *)&this->bytes = 0;
  (this->offset).addr = 0;
  (this->align).addr = 0;
  *(undefined8 *)&this->isAtomic = 0;
  (this->super_SpecificExpression<(wasm::Expression::Id)13>).super_Expression._id = StoreId;
  this->bytes = (uint8_t)bytes;
  (this->offset).addr = (ulong)offset;
  (this->align).addr = (ulong)align;
  this->ptr = ptr;
  this->value = value;
  (this->valueType).id = type;
  (this->memory).super_IString.str = sVar1;
  wasm::Store::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenStore(BinaryenModuleRef module,
                                    uint32_t bytes,
                                    uint32_t offset,
                                    uint32_t align,
                                    BinaryenExpressionRef ptr,
                                    BinaryenExpressionRef value,
                                    BinaryenType type,
                                    const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeStore(bytes,
                 offset,
                 align ? align : bytes,
                 (Expression*)ptr,
                 (Expression*)value,
                 Type(type),
                 getMemoryName(module, memoryName)));
}